

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QString * simpleTypeString(QString *__return_storage_ptr__,Type t)

{
  QString *this;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QMessageLogger local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)(t + 0xffffff00) < 0x100) {
    this = (QString *)QByteArrayView::lengthHelperCharArray("simple(%1)",0xb);
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"simple(%1)";
    QString::fromLatin1((QString *)&local_48,this,ba);
    QString::arg<int,_true>
              (__return_storage_ptr__,(QString *)&local_48,t + 0xffffff00,0,10,(QChar)0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  }
  else {
    local_48.context.version = 2;
    local_48.context.function._4_4_ = 0;
    local_48.context._4_8_ = 0;
    local_48.context._12_8_ = 0;
    local_48.context.category = "default";
    QMessageLogger::warning(&local_48,"QCborValue: found unknown type 0x%x");
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString simpleTypeString(QCborValue::Type t)
{
    int simpleType = t - QCborValue::SimpleType;
    if (unsigned(simpleType) < 0x100)
        return QString::fromLatin1("simple(%1)").arg(simpleType);

    // if we got here, we got an unknown type
    qWarning("QCborValue: found unknown type 0x%x", t);
    return QString();

}